

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderPreservePattern(xmlTextReaderPtr reader,xmlChar *pattern,xmlChar **namespaces)

{
  int iVar1;
  xmlPatternPtr pxVar2;
  xmlPatternPtr *ppxVar3;
  int newSize;
  xmlPatternPtr *tmp;
  xmlPatternPtr comp;
  xmlChar **namespaces_local;
  xmlChar *pattern_local;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (pattern == (xmlChar *)0x0)) {
    reader_local._4_4_ = -1;
  }
  else {
    pxVar2 = xmlPatterncompile(pattern,reader->dict,0,namespaces);
    if (pxVar2 == (xmlPatternPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      if (reader->patternMax <= reader->patternNr) {
        iVar1 = xmlGrowCapacity(reader->patternMax,8,4,1000000000);
        if (iVar1 < 0) {
          xmlTextReaderErrMemory(reader);
          return -1;
        }
        ppxVar3 = (xmlPatternPtr *)(*xmlRealloc)(reader->patternTab,(long)iVar1 << 3);
        if (ppxVar3 == (xmlPatternPtr *)0x0) {
          xmlTextReaderErrMemory(reader);
          return -1;
        }
        reader->patternTab = ppxVar3;
        reader->patternMax = iVar1;
      }
      reader->patternTab[reader->patternNr] = pxVar2;
      reader_local._4_4_ = reader->patternNr;
      reader->patternNr = reader_local._4_4_ + 1;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderPreservePattern(xmlTextReaderPtr reader, const xmlChar *pattern,
                             const xmlChar **namespaces)
{
    xmlPatternPtr comp;

    if ((reader == NULL) || (pattern == NULL))
	return(-1);

    comp = xmlPatterncompile(pattern, reader->dict, 0, namespaces);
    if (comp == NULL)
        return(-1);

    if (reader->patternNr >= reader->patternMax) {
        xmlPatternPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->patternMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	tmp = xmlRealloc(reader->patternTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	reader->patternTab = tmp;
        reader->patternMax = newSize;
    }
    reader->patternTab[reader->patternNr] = comp;
    return(reader->patternNr++);
}